

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::
     seq_<jsonip::parser::char_<(char)102>,jsonip::parser::char_<(char)97>,jsonip::parser::char_<(char)108>,jsonip::parser::char_<(char)115>,jsonip::parser::char_<(char)101>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  bool bVar1;
  
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::push_state(state);
  bVar1 = char_<(char)102>::
          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                    (state);
  if ((((bVar1) &&
       (bVar1 = char_<(char)97>::
                match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                          (state), bVar1)) &&
      (bVar1 = char_<(char)108>::
               match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                         (state), bVar1)) &&
     ((bVar1 = char_<(char)115>::
               match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                         (state), bVar1 &&
      (bVar1 = char_<(char)101>::
               match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                         (state), bVar1)))) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::commit(state);
    return true;
  }
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::rollback(state);
  return false;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }